

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O3

int32 Js::JavascriptNumber::GetNonzeroInt32Value_NoTaggedIntCheck(Var object)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  double value;
  int32 iVar4;
  int32 iVar5;
  
  if (object == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0xa4,"(object)","object");
    if (bVar2) {
      *puVar3 = 0;
      return 0;
    }
  }
  else {
    if (((ulong)object & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)object & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)object & 0xffff000000000000) != 0x1000000000000) goto LAB_00cd9465;
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00cd94c0;
      *puVar3 = 0;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0xa5,"(!TaggedInt::Is(object))","!TaggedInt::Is(object)");
    if (bVar2) {
      *puVar3 = 0;
LAB_00cd9465:
      iVar4 = 0;
      iVar5 = 0;
      if ((ulong)object >> 0x32 != 0) {
        value = (double)((ulong)object ^ 0xfffc000000000000);
        iVar5 = iVar4;
        if ((((double)(int)value == value) && (!NAN((double)(int)value) && !NAN(value))) &&
           (bVar2 = NumberUtilities::IsSpecial(value,0x8000000000000000), !bVar2)) {
          iVar5 = (int32)value;
        }
      }
      return iVar5;
    }
  }
LAB_00cd94c0:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int32 JavascriptNumber::GetNonzeroInt32Value_NoTaggedIntCheck(const Var object)
    {
        Assert(object);
        Assert(!TaggedInt::Is(object));

        int32 i;
        return Is_NoTaggedIntCheck(object) && TryGetInt32Value(GetValue(object), &i) ? i : 0;
    }